

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9Cof(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Gia_Man_t *pGVar2;
  char *pcVar3;
  uint local_40;
  uint local_3c;
  int nLimFan;
  int iVar;
  int fVerbose;
  int c;
  Gia_Man_t *pTemp;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  nLimFan = 0;
  local_3c = 0;
  local_40 = 0;
  Extra_UtilGetoptReset();
  do {
    while( true ) {
      iVar1 = Extra_UtilGetopt(argc,argv,"VLvh");
      if (iVar1 == -1) {
        if (pAbc->pGia == (Gia_Man_t *)0x0) {
          Abc_Print(-1,"Abc_CommandAbc9Cof(): There is no AIG.\n");
          return 1;
        }
        if (local_40 == 0) {
          if (local_3c == 0) {
            Abc_Print(-1,
                      "One of the parameters, -V <num> or -L <num>, should be set on the command line.\n"
                     );
            goto LAB_0025bfcd;
          }
          Abc_Print(-1,"Cofactoring one variable with object ID %d.\n",(ulong)local_3c);
          pGVar2 = Gia_ManDupCof(pAbc->pGia,local_3c);
          Abc_FrameUpdateGia(pAbc,pGVar2);
        }
        else {
          Abc_Print(-1,"Cofactoring all variables whose fanout count is higher than %d.\n",
                    (ulong)local_40);
          pGVar2 = Gia_ManDupCofAll(pAbc->pGia,local_40,nLimFan);
          Abc_FrameUpdateGia(pAbc,pGVar2);
        }
        return 0;
      }
      if (iVar1 == 0x4c) break;
      if (iVar1 == 0x56) {
        if (argc <= globalUtilOptind) {
          Abc_Print(-1,"Command line switch \"-V\" should be followed by an integer.\n");
          goto LAB_0025bfcd;
        }
        local_3c = atoi(argv[globalUtilOptind]);
        globalUtilOptind = globalUtilOptind + 1;
        if ((int)local_3c < 0) goto LAB_0025bfcd;
      }
      else {
        if ((iVar1 == 0x68) || (iVar1 != 0x76)) goto LAB_0025bfcd;
        nLimFan = nLimFan ^ 1;
      }
    }
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-L\" should be followed by an integer.\n");
      break;
    }
    local_40 = atoi(argv[globalUtilOptind]);
    globalUtilOptind = globalUtilOptind + 1;
  } while (-1 < (int)local_40);
LAB_0025bfcd:
  Abc_Print(-2,"usage: &cof [-VL num] [-vh]\n");
  Abc_Print(-2,"\t         performs cofactoring w.r.t. variable(s)\n");
  Abc_Print(-2,"\t-V num : the zero-based ID of one variable to cofactor [default = %d]\n",
            (ulong)local_3c);
  Abc_Print(-2,"\t-L num : cofactor vars with fanout count higher than this [default = %d]\n",
            (ulong)local_40);
  pcVar3 = "no";
  if (nLimFan != 0) {
    pcVar3 = "yes";
  }
  Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar3);
  Abc_Print(-2,"\t-h     : print the command usage\n");
  return 1;
}

Assistant:

int Abc_CommandAbc9Cof( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Gia_Man_t * pTemp;
    int c, fVerbose = 0;
    int iVar = 0, nLimFan = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "VLvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'V':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-V\" should be followed by an integer.\n" );
                goto usage;
            }
            iVar = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( iVar < 0 )
                goto usage;
            break;
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by an integer.\n" );
                goto usage;
            }
            nLimFan = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nLimFan < 0 )
                goto usage;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Cof(): There is no AIG.\n" );
        return 1;
    }
    if ( nLimFan )
    {
        Abc_Print( -1, "Cofactoring all variables whose fanout count is higher than %d.\n", nLimFan );
        pTemp = Gia_ManDupCofAll( pAbc->pGia, nLimFan, fVerbose );
        Abc_FrameUpdateGia( pAbc, pTemp );
    }
    else if ( iVar )
    {
        Abc_Print( -1, "Cofactoring one variable with object ID %d.\n", iVar );
        pTemp = Gia_ManDupCof( pAbc->pGia, iVar );
        Abc_FrameUpdateGia( pAbc, pTemp );
    }
    else
    {
        Abc_Print( -1, "One of the parameters, -V <num> or -L <num>, should be set on the command line.\n" );
        goto usage;
    }
    return 0;

usage:
    Abc_Print( -2, "usage: &cof [-VL num] [-vh]\n" );
    Abc_Print( -2, "\t         performs cofactoring w.r.t. variable(s)\n" );
    Abc_Print( -2, "\t-V num : the zero-based ID of one variable to cofactor [default = %d]\n", iVar );
    Abc_Print( -2, "\t-L num : cofactor vars with fanout count higher than this [default = %d]\n", nLimFan );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}